

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::updateArrow(QComboBoxPrivate *this,StateFlag state)

{
  QStyleOptionComboBox *this_00;
  StateFlag in_ESI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QComboBox *q;
  QStyleOptionComboBox opt;
  undefined4 in_stack_ffffffffffffff48;
  undefined1 local_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QStyleOptionComboBox *)q_func(in_RDI);
  if (in_RDI->arrowState != in_ESI) {
    in_RDI->arrowState = in_ESI;
    memset(local_98,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)0x530bbc);
    (**(code **)(*(long *)&(this_00->super_QStyleOptionComplex).super_QStyleOption + 0x1b8))
              (this_00,local_98);
    QWidget::rect((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffff48));
    QWidget::update((QWidget *)in_RDI,(QRect *)this_00);
    QStyleOptionComboBox::~QStyleOptionComboBox(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::updateArrow(QStyle::StateFlag state)
{
    Q_Q(QComboBox);
    if (arrowState == state)
        return;
    arrowState = state;
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
    q->update(q->rect());
}